

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

void __thiscall Al::al_exception::~al_exception(al_exception *this)

{
  ~al_exception(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

al_exception(const std::string m, const std::string f, const int l) :
    msg(m), file(f), line(l) {
    err = file + ":" + std::to_string(line) + " - " + msg;
  }